

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitRefFunc(I64ToI32Lowering *this,RefFunc *curr)

{
  Type *pTVar1;
  Type *pTVar2;
  Type TVar3;
  Type TVar4;
  Type *this_00;
  Signature sig_00;
  HeapType local_80;
  undefined1 local_78 [8];
  Signature sig;
  Type t;
  Iterator __begin3;
  undefined1 auStack_48 [8];
  Iterator __begin2;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type;
  auStack_48 = (undefined1  [8])wasm::Type::getHeapType(this_00);
  _local_78 = HeapType::getSignature((HeapType *)auStack_48);
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  auStack_48 = (undefined1  [8])local_78;
  pTVar1 = (Type *)wasm::Type::size((Type *)local_78);
  if (pTVar1 != (Type *)0x0) {
    do {
      pTVar2 = wasm::Type::Iterator::operator*((Iterator *)auStack_48);
      if (pTVar2->id == 3) {
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
        auStack_48 = (undefined1  [8])0x0;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        t.id = (uintptr_t)local_78;
        pTVar1 = (Type *)wasm::Type::size((Type *)local_78);
        if (pTVar1 == (Type *)0x0) goto LAB_008dd88b;
        goto LAB_008dd7cf;
      }
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              pTVar1) || (auStack_48 != (undefined1  [8])local_78));
  }
  TVar3.id = (uintptr_t)local_78;
  goto LAB_008dd8b1;
LAB_008dd7cf:
  do {
    pTVar2 = wasm::Type::Iterator::operator*((Iterator *)&t);
    sig.results.id = pTVar2->id;
    if (sig.results.id == 3) {
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 2;
      if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
          (Type *)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
         ) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,
                   (iterator)
                   __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent,(Type *)&__begin3.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .index);
      }
      else {
        (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent)->id =
             2;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent + 1
        ;
      }
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 2;
      if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
          (Type *)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
         ) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,
                   (iterator)
                   __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent,(Type *)&__begin3.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .index);
      }
      else {
        (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent)->id =
             2;
LAB_008dd841:
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent + 1
        ;
      }
    }
    else {
      if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
          (Type *)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
         ) {
        (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent)->id =
             (uintptr_t)sig.results;
        goto LAB_008dd841;
      }
      std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_48,
                 (iterator)
                 __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                 ,&sig.results);
    }
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)((long)&(__begin3.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                         )->id + 1);
  } while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
            pTVar1) || ((Type *)t.id != (Type *)local_78));
LAB_008dd88b:
  wasm::Type::Type(&t,(Tuple *)auStack_48);
  TVar3 = t;
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index - (long)auStack_48);
  }
LAB_008dd8b1:
  TVar4.id = 2;
  if ((sig.params.id == 3) || (TVar4.id = sig.params.id, (undefined1  [8])TVar3.id != local_78)) {
    sig_00.results.id = TVar4.id;
    sig_00.params.id = TVar3.id;
    HeapType::HeapType(&local_80,sig_00);
    TVar3 = wasm::Type::with(this_00,local_80);
    this_00->id = TVar3.id;
  }
  return;
}

Assistant:

void visitRefFunc(RefFunc* curr) {
    auto sig = curr->type.getHeapType().getSignature();

    bool hasI64Param = false;
    for (auto t : sig.params) {
      if (t == Type::i64) {
        hasI64Param = true;
        break;
      }
    }
    auto params = sig.params;
    if (hasI64Param) {
      std::vector<Type> newParams;
      for (auto t : sig.params) {
        if (t == Type::i64) {
          newParams.push_back(Type::i32);
          newParams.push_back(Type::i32);
        } else {
          newParams.push_back(t);
        }
      }
      params = Type(newParams);
    };
    auto results = sig.results;
    // Update the results the same way we do when visiting functions. We use a
    // global rather than multivalue to lower i64 results.
    if (results == Type::i64) {
      results = Type::i32;
    }

    if (params != sig.params || results != sig.results) {
      curr->type = curr->type.with(HeapType(Signature(params, results)));
    }
  }